

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O0

ssize_t __thiscall
boost::deflate::detail::window::write(window *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  type puVar3;
  undefined4 in_register_00000034;
  int m;
  void *local_20;
  size_t n_local;
  uint8_t *in_local;
  window *this_local;
  
  n_local = CONCAT44(in_register_00000034,__fd);
  local_20 = __buf;
  in_local = (uint8_t *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (!bVar1) {
    make_unique<unsigned_char[]>((boost *)&stack0xffffffffffffffd8,(ulong)this->capacity_);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&this->p_,
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               &stack0xffffffffffffffd8);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               &stack0xffffffffffffffd8);
  }
  if (local_20 < (void *)(ulong)this->capacity_) {
    if ((ulong)this->capacity_ < (ulong)this->i_ + (long)local_20) {
      iVar2 = (uint)this->capacity_ - (uint)this->i_;
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&this->p_,(ulong)this->i_);
      memcpy(puVar3,(void *)n_local,(long)iVar2);
      n_local = n_local + (long)iVar2;
      this->i_ = (short)local_20 - (short)iVar2;
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&this->p_,0);
      memcpy(puVar3,(void *)n_local,(ulong)this->i_);
      this->size_ = this->capacity_;
    }
    else {
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&this->p_,(ulong)this->i_);
      memcpy(puVar3,(void *)n_local,(size_t)local_20);
      if ((ulong)this->size_ < (ulong)this->capacity_ - (long)local_20) {
        this->size_ = this->size_ + (short)local_20;
      }
      else {
        this->size_ = this->capacity_;
      }
      this->i_ = (uint16_t)(((ulong)this->i_ + (long)local_20) % (ulong)this->capacity_);
    }
  }
  else {
    this->i_ = 0;
    this->size_ = this->capacity_;
    puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       (&this->p_,0);
    this = (window *)
           memcpy(puVar3,(void *)((long)local_20 + (n_local - this->size_)),(ulong)this->size_);
  }
  return (ssize_t)this;
}

Assistant:

void
    write(std::uint8_t const* in, std::size_t n)
    {
        if(! p_)
            p_ = boost::make_unique<
                std::uint8_t[]>(capacity_);
        if(n >= capacity_)
        {
            i_ = 0;
            size_ = capacity_;
            std::memcpy(&p_[0], in + (n - size_), size_);
            return;
        }
        if(i_ + n <= capacity_)
        {
            std::memcpy(&p_[i_], in, n);
            if(size_ >= capacity_ - n)
                size_ = capacity_;
            else
                size_ = static_cast<std::uint16_t>(size_ + n);

            i_ = static_cast<std::uint16_t>(
                (i_ + n) % capacity_);
            return;
        }
        auto m = capacity_ - i_;
        std::memcpy(&p_[i_], in, m);
        in += m;
        i_ = static_cast<std::uint16_t>(n - m);
        std::memcpy(&p_[0], in, i_);
        size_ = capacity_;
    }